

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::addedCols(SPxBasisBase<double> *this,int n)

{
  Representation RVar1;
  int iVar2;
  int iVar3;
  SPxStatus SVar4;
  Status *pSVar5;
  SPxId *this_00;
  ostream *this_01;
  string *m;
  int in_ESI;
  SPxBasisBase<double> *in_RDI;
  int i_1;
  int i;
  undefined8 in_stack_ffffffffffffff78;
  SPxBasisBase<double> *in_stack_ffffffffffffff80;
  allocator *this_02;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Status in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Status in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  SPxBasisBase<double> *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  DataKey local_18;
  int local_10;
  int local_c;
  
  if (0 < in_ESI) {
    local_c = in_ESI;
    reDim(in_stack_ffffffffffffffb0);
    RVar1 = SPxSolverBase<double>::rep(in_RDI->theLP);
    if (RVar1 == ROW) {
      local_10 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x23a76a);
      local_10 = local_10 - local_c;
      while (iVar3 = local_10, iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x23a788),
            iVar3 < iVar2) {
        in_stack_ffffffffffffff98 =
             primalColStatus<double>
                       ((int)in_RDI,(SPxLPBase<double> *)CONCAT44(iVar3,in_stack_ffffffffffffff98));
        pSVar5 = Desc::colStatus((Desc *)in_stack_ffffffffffffff80,
                                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        *pSVar5 = in_stack_ffffffffffffff98;
        local_18 = (DataKey)SPxLPBase<double>::cId
                                      ((SPxLPBase<double> *)
                                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                                       ,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        this_00 = baseId(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        SPxId::operator=(this_00,(SPxColId *)&local_18);
        local_10 = local_10 + 1;
      }
    }
    else {
      local_1c = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x23a818);
      local_1c = local_1c - local_c;
      while (in_stack_ffffffffffffff94 = local_1c,
            iVar3 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x23a836),
            in_stack_ffffffffffffff94 < iVar3) {
        in_stack_ffffffffffffff90 =
             primalColStatus<double>
                       ((int)in_RDI,
                        (SPxLPBase<double> *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        pSVar5 = Desc::colStatus((Desc *)in_stack_ffffffffffffff80,
                                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        *pSVar5 = in_stack_ffffffffffffff90;
        local_1c = local_1c + 1;
      }
    }
    SVar4 = status(in_RDI);
    if ((NO_PROBLEM < SVar4) && ((in_RDI->matrixIsSetup & 1U) != 0)) {
      loadMatrixVecs(in_RDI);
    }
    SVar4 = status(in_RDI);
    if (2 < (uint)(SVar4 + PRIMAL)) {
      if (SVar4 != DUAL) {
        if (SVar4 == PRIMAL) {
          return;
        }
        if ((uint)(SVar4 + ~PRIMAL) < 2) {
          setStatus((SPxBasisBase<double> *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),SVar4);
          return;
        }
        if (SVar4 != INFEASIBLE) {
          this_01 = std::operator<<((ostream *)&std::cerr,"ECHBAS08 Unknown basis status!");
          std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
          m = (string *)__cxa_allocate_exception(0x28);
          this_02 = &local_41;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_40,"XCHBAS02 This should never happen.",this_02);
          SPxInternalCodeException::SPxInternalCodeException((SPxInternalCodeException *)this_02,m);
          __cxa_throw(m,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        }
      }
      setStatus((SPxBasisBase<double> *)
                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),SVar4);
    }
  }
  return;
}

Assistant:

void SPxBasisBase<R>::addedCols(int n)
{
   assert(theLP != nullptr);

   if(n > 0)
   {
      reDim();

      if(theLP->rep() == SPxSolverBase<R>::ROW)
      {
         /* after adding columns in row representation, reDim() should set these bools to false. */
         assert(!matrixIsSetup && !factorized);

         for(int i = theLP->nCols() - n; i < theLP->nCols(); ++i)
         {
            thedesc.colStatus(i) = primalColStatus(i, theLP);
            baseId(i) = theLP->SPxLPBase<R>::cId(i);
         }
      }
      else
      {
         assert(theLP->rep() == SPxSolverBase<R>::COLUMN);

         for(int i = theLP->nCols() - n; i < theLP->nCols(); ++i)
            thedesc.colStatus(i) = primalColStatus(i, theLP);
      }

      /* If matrix was set up, load new basis vectors to the matrix
       * In the column case, the basis is not effected by adding columns. However,
       * since @c matrix stores references to the columns in the LP (SPxLPBase<R>), a realloc
       * in SPxLPBase<R> (e.g. due to space requirements) might invalidate these references.
       * We therefore have to "reload" the matrix if it is set up. Note that reDim()
       * leaves @c matrixIsSetup untouched if only columns have been added, since the
       * basis matrix already has the correct size. */
      if(status() > NO_PROBLEM && matrixIsSetup)
         loadMatrixVecs();

      switch(status())
      {
      case DUAL:
      case INFEASIBLE:
         setStatus(REGULAR);
         break;

      case OPTIMAL:
      case UNBOUNDED:
         setStatus(PRIMAL);
         break;

      case NO_PROBLEM:
      case SINGULAR:
      case REGULAR:
      case PRIMAL:
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ECHBAS08 Unknown basis status!" << std::endl;)
         throw SPxInternalCodeException("XCHBAS02 This should never happen.");
      }
   }
}